

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::FeatureDescription::set_name(FeatureDescription *this,char *value)

{
  LogMessage *other;
  allocator local_71;
  string local_70;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/../build/format/Model.pb.h"
               ,0x9ea);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  std::__cxx11::string::string((string *)&local_70,value,&local_71);
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,&local_70)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void FeatureDescription::set_name(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  
  name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:CoreML.Specification.FeatureDescription.name)
}